

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.cpp
# Opt level: O0

void __thiscall
o3dgc::Adaptive_Data_Model::set_alphabet(Adaptive_Data_Model *this,uint number_of_symbols)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  uint *puVar3;
  int local_18;
  uint table_bits;
  uint number_of_symbols_local;
  Adaptive_Data_Model *this_local;
  
  if ((number_of_symbols < 2) || (0x800 < number_of_symbols)) {
    AC_Error("invalid number of data symbols");
  }
  if (this->data_symbols != number_of_symbols) {
    this->data_symbols = number_of_symbols;
    this->last_symbol = this->data_symbols - 1;
    if (this->distribution != (uint *)0x0) {
      operator_delete__(this->distribution);
    }
    if (this->data_symbols < 0x11) {
      this->decoder_table = (uint *)0x0;
      this->table_shift = 0;
      this->table_size = 0;
      auVar1 = ZEXT416(this->data_symbols << 1) * ZEXT816(4);
      uVar2 = auVar1._0_8_;
      if (auVar1._8_8_ != 0) {
        uVar2 = 0xffffffffffffffff;
      }
      puVar3 = (uint *)operator_new__(uVar2);
      this->distribution = puVar3;
    }
    else {
      local_18 = 3;
      while ((uint)(1 << ((byte)local_18 + 2 & 0x1f)) < this->data_symbols) {
        local_18 = local_18 + 1;
      }
      this->table_size = 1 << ((byte)local_18 & 0x1f);
      this->table_shift = 0xf - local_18;
      auVar1 = ZEXT416(this->data_symbols * 2 + this->table_size + 2) * ZEXT816(4);
      uVar2 = auVar1._0_8_;
      if (auVar1._8_8_ != 0) {
        uVar2 = 0xffffffffffffffff;
      }
      puVar3 = (uint *)operator_new__(uVar2);
      this->distribution = puVar3;
      this->decoder_table = this->distribution + (this->data_symbols << 1);
    }
    this->symbol_count = this->distribution + this->data_symbols;
    if (this->distribution == (uint *)0x0) {
      AC_Error("cannot assign model memory");
    }
  }
  reset(this);
  return;
}

Assistant:

void Adaptive_Data_Model::set_alphabet(unsigned number_of_symbols)
    {
      if ((number_of_symbols < 2) || (number_of_symbols > (1 << 11)))
        AC_Error("invalid number of data symbols");

      if (data_symbols != number_of_symbols) {     // assign memory for data model
        data_symbols = number_of_symbols;
        last_symbol = data_symbols - 1;
        delete [] distribution;
                                         // define size of table for fast decoding
        if (data_symbols > 16) {
          unsigned table_bits = 3;
          while (data_symbols > (1U << (table_bits + 2))) ++table_bits;
          table_size  = 1 << table_bits;
          table_shift = DM__LengthShift - table_bits;
          distribution = new unsigned[2*data_symbols+table_size+2];
          decoder_table = distribution + 2 * data_symbols;
        }
        else {                                  // small alphabet: no table needed
          decoder_table = 0;
          table_size = table_shift = 0;
          distribution = new unsigned[2*data_symbols];
        }
        symbol_count = distribution + data_symbols;
        if (distribution == 0) AC_Error("cannot assign model memory");
      }

      reset();                                                 // initialize model
    }